

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opt_array_splitting.cpp
# Opt level: O2

void __thiscall
ir_array_splitting_visitor::handle_rvalue(ir_array_splitting_visitor *this,ir_rvalue **rvalue)

{
  ir_rvalue *piVar1;
  ir_dereference *deref;
  ir_rvalue *local_18;
  
  piVar1 = *rvalue;
  if (piVar1 != (ir_rvalue *)0x0) {
    local_18 = (ir_rvalue *)0x0;
    if ((piVar1->super_ir_instruction).ir_type < ir_type_constant) {
      local_18 = piVar1;
    }
    if (local_18 != (ir_rvalue *)0x0) {
      split_deref(this,(ir_dereference **)&local_18);
      *rvalue = local_18;
    }
  }
  return;
}

Assistant:

void
ir_array_splitting_visitor::handle_rvalue(ir_rvalue **rvalue)
{
   if (!*rvalue)
      return;

   ir_dereference *deref = (*rvalue)->as_dereference();

   if (!deref)
      return;

   split_deref(&deref);
   *rvalue = deref;
}